

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall
QPropertyAnimationPrivate::updateProperty(QPropertyAnimationPrivate *this,QVariant *newValue)

{
  parameter_type pVar1;
  int iVar2;
  parameter_type pQVar3;
  arrow_operator_result ppQVar4;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int flags;
  int status;
  void *argv [4];
  void **in_stack_ffffffffffffffa8;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *in_stack_ffffffffffffffb0;
  QObject *this_00;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pVar1 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x682ae3);
  if ((pVar1 != Stopped) &&
     (pQVar3 = ::QObjectCompatProperty::operator_cast_to_QObject_
                         ((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                           *)0x682afe), pQVar3 != (parameter_type)0x0)) {
    iVar2 = ::QVariant::userType((QVariant *)0x682b13);
    if (iVar2 == *(int *)&in_RDI[0x16].d_ptr.d) {
      local_2c = 0xffffffff;
      local_30 = 0;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = (undefined4 *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = (undefined4 *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = (undefined1 *)::QVariant::constData((QVariant *)0x682b6e);
      local_18 = &local_2c;
      local_10 = &local_30;
      ::QObjectCompatProperty::operator_cast_to_QObject_
                ((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                  *)0x682ba2);
      QMetaObject::metacall
                (in_RDI,(Call)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      ppQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                ::operator->(in_stack_ffffffffffffffb0);
      this_00 = *ppQVar4;
      QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
      ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               *)this_00);
      QByteArray::constData((QByteArray *)0x682bf3);
      QObject::setProperty(this_00,(char *)in_stack_ffffffffffffffa8,(QVariant *)0x682c05);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimationPrivate::updateProperty(const QVariant &newValue)
{
    if (state == QAbstractAnimation::Stopped)
        return;

    if (!targetObject)
        return;

    if (newValue.userType() == propertyType) {
        //no conversion is needed, we directly call the QMetaObject::metacall
        //check QMetaProperty::write for an explanation of these
        int status = -1;
        int flags = 0;
        void *argv[] = { const_cast<void *>(newValue.constData()), const_cast<QVariant *>(&newValue), &status, &flags };
        QMetaObject::metacall(targetObject, QMetaObject::WriteProperty, propertyIndex, argv);
    } else {
        targetObject->setProperty(propertyName.value().constData(), newValue);
    }
}